

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::validate(FragmentStamp *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  size_t sVar7;
  reference piVar8;
  long in_RDI;
  iterator j;
  vector<int,_std::allocator<int>_> members;
  RigidBodyStamp *rbStamp;
  size_t i_1;
  uint i;
  DataHolder *in_stack_000000d0;
  FragmentStamp *in_stack_00000110;
  FragmentStamp *in_stack_000001e0;
  FragmentStamp *in_stack_00000200;
  FragmentStamp *in_stack_00000380;
  FragmentStamp *in_stack_00000580;
  FragmentStamp *in_stack_00000680;
  FragmentStamp *in_stack_000007e0;
  RigidBodyStamp *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  size_type in_stack_fffffffffffffef8;
  FragmentStamp *in_stack_ffffffffffffff10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d0 [4];
  RigidBodyStamp *local_b0;
  ulong local_a8;
  uint local_9c;
  undefined1 local_98 [80];
  string local_48 [72];
  
  DataHolder::validate(in_stack_000000d0);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffed8);
    bVar1 = NotEmptyConstraint::operator()
                      ((NotEmptyConstraint *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (string *)in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_48);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x3e50fb);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar2 = std::__cxx11::string::c_str();
      in_stack_ffffffffffffff10 = (FragmentStamp *)local_98;
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_fffffffffffffed8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string((string *)(local_98 + 0x20));
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x3e5192);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8);
  getNAtoms((FragmentStamp *)0x3e5244);
  std::vector<int,_std::allocator<int>_>::resize(this_00,in_stack_fffffffffffffef8);
  local_9c = 0;
  while( true ) {
    uVar4 = (ulong)local_9c;
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8));
    if (sVar5 <= uVar4) break;
    in_stack_fffffffffffffef4 = -1 - local_9c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(ulong)local_9c);
    *pvVar6 = in_stack_fffffffffffffef4;
    local_9c = local_9c + 1;
  }
  for (local_a8 = 0; uVar4 = local_a8, sVar7 = getNRigidBodies((FragmentStamp *)0x3e52ec),
      uVar4 < sVar7; local_a8 = local_a8 + 1) {
    local_b0 = getRigidBodyStamp((FragmentStamp *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    RigidBodyStamp::getMembers(in_stack_fffffffffffffed8);
    local_d0[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffed8);
      if (!bVar1) break;
      in_stack_fffffffffffffee4 = (value_type)local_a8;
      in_stack_fffffffffffffed8 = (RigidBodyStamp *)(in_RDI + 0x1c8);
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_d0);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8,
                          (long)*piVar8);
      *pvVar6 = in_stack_fffffffffffffee4;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_d0);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  checkAtoms(in_stack_00000110);
  checkBonds(in_stack_00000380);
  fillBondInfo(in_stack_ffffffffffffff10);
  checkBends(in_stack_000007e0);
  checkTorsions(in_stack_00000580);
  checkInversions(in_stack_00000680);
  checkRigidBodies(in_stack_00000200);
  checkCutoffGroups(in_stack_000001e0);
  checkConstraints(in_stack_00000380);
  checkNodes(in_stack_00000200);
  return;
}

Assistant:

void FragmentStamp::validate() {
    DataHolder::validate();
    CheckParameter(Name, isNotEmpty());

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }
    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkConstraints();
    checkNodes();
  }